

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

int __thiscall Escape::CGraph::copy(CGraph *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  CGraph *ret;
  CGraph *this_local;
  
  newCGraph(this,*(VertexIdx *)dst,*(EdgeIdx *)(dst + 8));
  std::copy<long*,long*>
            (*(long **)(dst + 0x10),(long *)(*(long *)(dst + 0x10) + *(long *)dst * 8 + 8),
             this->offsets);
  std::copy<long*,long*>
            (*(long **)(dst + 0x18),(long *)(*(long *)(dst + 0x18) + *(long *)(dst + 8) * 8),
             this->nbors);
  return (int)this;
}

Assistant:

CGraph CGraph::copy() const {
    CGraph ret = newCGraph(nVertices, nEdges);
    std::copy(offsets, offsets + nVertices + 1, ret.offsets);
    std::copy(nbors, nbors + nEdges, ret.nbors);
    return ret;
}